

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O2

result_type __thiscall trng::mt19937::operator()(mt19937 *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = (this->S).mti;
  if (0x26f < iVar1) {
    for (lVar3 = 0; lVar3 != 0xe3; lVar3 = lVar3 + 1) {
      uVar2 = (this->S).mt[lVar3 + 1];
      (this->S).mt[lVar3] =
           *(uint *)(&DAT_00106150 + (ulong)(uVar2 & 1) * 4) ^ (this->S).mt[lVar3 + 0x18d] ^
           (uVar2 & 0x7ffffffe | (this->S).mt[lVar3] & 0x80000000) >> 1;
    }
    for (lVar3 = 0; lVar3 != 0x18c; lVar3 = lVar3 + 1) {
      uVar2 = (this->S).mt[lVar3 + 0xe4];
      (this->S).mt[lVar3 + 0xe3] =
           *(uint *)(&DAT_00106150 + (ulong)(uVar2 & 1) * 4) ^ (this->S).mt[lVar3] ^
           (uVar2 & 0x7ffffffe | (this->S).mt[lVar3 + 0xe3] & 0x80000000) >> 1;
    }
    uVar2 = (this->S).mt[0];
    (this->S).mt[0x26f] =
         *(uint *)(&DAT_00106150 + (ulong)(uVar2 & 1) * 4) ^ (this->S).mt[0x18c] ^
         (uVar2 & 0x7ffffffe | (this->S).mt[0x26f] & 0x80000000) >> 1;
    iVar1 = 0;
  }
  (this->S).mti = iVar1 + 1;
  uVar2 = (this->S).mt[iVar1];
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

inline mt19937::result_type mt19937::operator()() {
    const result_type mag01[2]{0u, 0x9908b0dfu};
    if (S.mti >= N) {  // generate N words at one time
      int i{0};
      for (; i < N - M; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & mt19937::LM)};
        S.mt[i] = S.mt[i + M] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      for (; i < N - 1; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & LM)};
        S.mt[i] = S.mt[i + (M - N)] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      const result_type x{(S.mt[N - 1] & mt19937::UM) | (S.mt[0] & mt19937::LM)};
      S.mt[N - 1] = S.mt[M - 1] ^ (x >> 1u) ^ mag01[x & 0x1u];
      S.mti = 0;
    }
    result_type x{S.mt[S.mti++]};
    x ^= (x >> 11u);
    x ^= (x << 7u) & 0x9d2c5680u;
    x ^= (x << 15u) & 0xefc60000u;
    x ^= (x >> 18u);
    return x;
  }